

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OutputOptions.cpp
# Opt level: O1

void __thiscall nvtt::OutputOptions::OutputOptions(OutputOptions *this)

{
  Private *pPVar1;
  
  pPVar1 = (Private *)operator_new(0x28);
  *(undefined8 *)&(pPVar1->fileName).super_StringBuilder = 0;
  (pPVar1->fileName).super_StringBuilder.m_str = (char *)0x0;
  pPVar1->outputHandler = (OutputHandler *)0x0;
  pPVar1->errorHandler = (ErrorHandler *)0x0;
  *(undefined8 *)&pPVar1->outputHeader = 0;
  nv::StringBuilder::StringBuilder((StringBuilder *)pPVar1);
  this->m = pPVar1;
  nv::StringBuilder::reset((StringBuilder *)pPVar1);
  pPVar1 = this->m;
  pPVar1->outputHandler = (OutputHandler *)0x0;
  pPVar1->errorHandler = (ErrorHandler *)0x0;
  pPVar1->outputHeader = true;
  return;
}

Assistant:

OutputOptions::OutputOptions() : m(*new OutputOptions::Private())
{
	reset();
}